

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

int rply_face_callback(p_ply_argument argument)

{
  runtime_error *this;
  double dVar1;
  long value_index;
  long length;
  int *buffer;
  long index;
  long local_30;
  long local_28;
  void *local_20;
  long local_18;
  
  ply_get_argument_user_data(argument,&local_20,(long *)0x0);
  ply_get_argument_property(argument,(p_ply_property *)0x0,&local_28,&local_30);
  if (local_30 == -1) {
    if (local_28 != 3) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"Found face with vertex count different from 3, only triangles are supported")
      ;
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    ply_get_argument_element(argument,(p_ply_element *)0x0,&local_18);
    dVar1 = ply_get_argument_value(argument);
    *(int *)((long)local_20 + local_30 * 4 + local_18 * 0xc) = (int)dVar1;
  }
  return 1;
}

Assistant:

static int rply_face_callback(p_ply_argument argument) {
  int* buffer;
  ply_get_argument_user_data(argument, (void**)&buffer, nullptr);

  long length, value_index;
  ply_get_argument_property(argument, nullptr, &length, &value_index);

  // the first value of a list property, the one that gives the number of entries
  if (value_index == -1) {
    if (length != 3) {
      // NOTE: we can also handles quads if necessary (length == 4)
      throw std::runtime_error("Found face with vertex count different from 3, only triangles are supported");
    }
    return 1; // continue;
  }

  long index;
  ply_get_argument_element(argument, nullptr, &index);
  buffer[index * 3 + value_index] = (int)ply_get_argument_value(argument);
  return 1;
}